

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDGAssemblyAnnotationWriter.h
# Opt level: O2

void __thiscall
dg::debug::LLVMDGAssemblyAnnotationWriter::emitBasicBlockStartAnnot
          (LLVMDGAssemblyAnnotationWriter *this,BasicBlock *B,formatted_raw_ostream *os)

{
  _Base_ptr p_Var1;
  void *pvVar2;
  _Base_ptr p_Var3;
  AnnotationOptsT AVar4;
  long lVar5;
  iterator iVar6;
  raw_ostream *prVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  BasicBlock *local_38;
  
  if (this->opts != 0) {
    lVar5 = dg::getConstructedFunctions();
    for (p_Var9 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
        p_Var9 != (_Rb_tree_node_base *)(lVar5 + 8);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      p_Var1 = p_Var9[1]._M_parent;
      local_38 = B;
      iVar6 = std::
              _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
              ::find((_Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                      *)(p_Var1 + 3),(key_type *)&local_38);
      if (iVar6._M_node != (_Base_ptr)&p_Var1[3]._M_parent) {
        p_Var1 = iVar6._M_node[1]._M_parent;
        AVar4 = this->opts;
        if ((AVar4 & (ANNOTATE_POSTDOM|ANNOTATE_CD)) != 0) {
          prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)os,"  ; BB: ");
          prVar7 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar7,p_Var1);
          llvm::raw_ostream::operator<<(prVar7,"\n");
          AVar4 = this->opts;
        }
        if ((AVar4 & ANNOTATE_POSTDOM) != 0) {
          for (p_Var8 = *(_Rb_tree_node_base **)(p_Var1 + 8);
              p_Var8 != (_Rb_tree_node_base *)&p_Var1[7]._M_left;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            pvVar2 = *(void **)(p_Var8 + 1);
            prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)os,"  ; PDF: ");
            prVar7 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar7,pvVar2);
            llvm::raw_ostream::operator<<(prVar7,"\n");
          }
          p_Var3 = p_Var1[8]._M_right;
          if ((p_Var3 != (_Base_ptr)0x0) && (*(long *)p_Var3 != 0)) {
            prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)os,"  ; iPD: ");
            prVar7 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar7,p_Var3);
            llvm::raw_ostream::operator<<(prVar7,"\n");
          }
        }
        if ((this->opts & ANNOTATE_CD) != 0) {
          for (p_Var8 = *(_Rb_tree_node_base **)(p_Var1 + 5);
              p_Var8 != (_Rb_tree_node_base *)&p_Var1[4]._M_left;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            pvVar2 = *(void **)(p_Var8 + 1);
            prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)os,"  ; CD: ");
            prVar7 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar7,pvVar2);
            llvm::raw_ostream::operator<<(prVar7,"\n");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void emitBasicBlockStartAnnot(const llvm::BasicBlock *B,
                                  llvm::formatted_raw_ostream &os) override {
        if (opts == 0)
            return;

        for (const auto &it : getConstructedFunctions()) {
            LLVMDependenceGraph *sub = it.second;
            auto &cb = sub->getBlocks();
            auto I = cb.find(const_cast<llvm::BasicBlock *>(B));
            if (I != cb.end()) {
                LLVMBBlock *BB = I->second;
                if (opts & (ANNOTATE_POSTDOM | ANNOTATE_CD))
                    os << "  ; BB: " << BB << "\n";

                if (opts & ANNOTATE_POSTDOM) {
                    for (LLVMBBlock *p : BB->getPostDomFrontiers())
                        os << "  ; PDF: " << p << "\n";

                    LLVMBBlock *P = BB->getIPostDom();
                    if (P && P->getKey())
                        os << "  ; iPD: " << P << "\n";
                }

                if (opts & ANNOTATE_CD) {
                    for (LLVMBBlock *p : BB->controlDependence())
                        os << "  ; CD: " << p << "\n";
                }
            }
        }
    }